

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int gatherSelectWindowsCallback(Walker *pWalker,Expr *pExpr)

{
  if ((pExpr->op == 0xac) && ((pExpr->flags & 0x1000000) != 0)) {
    sqlite3WindowLink((pWalker->u).pSelect,(pExpr->y).pWin);
  }
  return 0;
}

Assistant:

static int gatherSelectWindowsCallback(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_FUNCTION && ExprHasProperty(pExpr, EP_WinFunc) ){
    Select *pSelect = pWalker->u.pSelect;
    Window *pWin = pExpr->y.pWin;
    assert( pWin );
    assert( IsWindowFunc(pExpr) );
    assert( pWin->ppThis==0 );
    sqlite3WindowLink(pSelect, pWin);
  }
  return WRC_Continue;
}